

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_msubv_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  int64_t iVar4;
  float64 fVar5;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  pfVar3 = (env->active_fpu).fpr + wt;
  switch(df) {
  case 0:
    iVar4 = msa_msubv_df(df,(long)*(char *)pfVar1,(long)*(char *)pfVar2,(long)*(char *)pfVar3);
    *(char *)pfVar1 = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 1),(long)*(char *)((long)pfVar2 + 1),
                         (long)*(char *)((long)pfVar3 + 1));
    *(char *)((long)pfVar1 + 1) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 2),(long)*(char *)((long)pfVar2 + 2),
                         (long)*(char *)((long)pfVar3 + 2));
    *(char *)((long)pfVar1 + 2) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 3),(long)*(char *)((long)pfVar2 + 3),
                         (long)*(char *)((long)pfVar3 + 3));
    *(char *)((long)pfVar1 + 3) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 4),(long)*(char *)((long)pfVar2 + 4),
                         (long)*(char *)((long)pfVar3 + 4));
    *(char *)((long)pfVar1 + 4) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 5),(long)*(char *)((long)pfVar2 + 5),
                         (long)*(char *)((long)pfVar3 + 5));
    *(char *)((long)pfVar1 + 5) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 6),(long)*(char *)((long)pfVar2 + 6),
                         (long)*(char *)((long)pfVar3 + 6));
    *(char *)((long)pfVar1 + 6) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 7),(long)*(char *)((long)pfVar2 + 7),
                         (long)*(char *)((long)pfVar3 + 7));
    *(char *)((long)pfVar1 + 7) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)(char)(&pfVar1->fd)[1],(long)(char)(&pfVar2->fd)[1],
                         (long)(char)(&pfVar3->fd)[1]);
    *(char *)(&pfVar1->fd + 1) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 9),(long)*(char *)((long)pfVar2 + 9),
                         (long)*(char *)((long)pfVar3 + 9));
    *(char *)((long)pfVar1 + 9) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 10),(long)*(char *)((long)pfVar2 + 10),
                         (long)*(char *)((long)pfVar3 + 10));
    *(char *)((long)pfVar1 + 10) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 0xb),(long)*(char *)((long)pfVar2 + 0xb),
                         (long)*(char *)((long)pfVar3 + 0xb));
    *(char *)((long)pfVar1 + 0xb) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 0xc),(long)*(char *)((long)pfVar2 + 0xc),
                         (long)*(char *)((long)pfVar3 + 0xc));
    *(char *)((long)pfVar1 + 0xc) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 0xd),(long)*(char *)((long)pfVar2 + 0xd),
                         (long)*(char *)((long)pfVar3 + 0xd));
    *(char *)((long)pfVar1 + 0xd) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 0xe),(long)*(char *)((long)pfVar2 + 0xe),
                         (long)*(char *)((long)pfVar3 + 0xe));
    *(char *)((long)pfVar1 + 0xe) = (char)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(char *)((long)pfVar1 + 0xf),(long)*(char *)((long)pfVar2 + 0xf),
                         (long)*(char *)((long)pfVar3 + 0xf));
    *(char *)((long)pfVar1 + 0xf) = (char)iVar4;
    break;
  case 1:
    iVar4 = msa_msubv_df(df,(long)*(short *)pfVar1,(long)*(short *)pfVar2,(long)*(short *)pfVar3);
    *(short *)pfVar1 = (short)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(short *)((long)pfVar1 + 2),(long)*(short *)((long)pfVar2 + 2),
                         (long)*(short *)((long)pfVar3 + 2));
    *(short *)((long)pfVar1 + 2) = (short)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(short *)((long)pfVar1 + 4),(long)*(short *)((long)pfVar2 + 4),
                         (long)*(short *)((long)pfVar3 + 4));
    *(short *)((long)pfVar1 + 4) = (short)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(short *)((long)pfVar1 + 6),(long)*(short *)((long)pfVar2 + 6),
                         (long)*(short *)((long)pfVar3 + 6));
    *(short *)((long)pfVar1 + 6) = (short)iVar4;
    iVar4 = msa_msubv_df(df,(long)(short)(&pfVar1->fd)[1],(long)(short)(&pfVar2->fd)[1],
                         (long)(short)(&pfVar3->fd)[1]);
    *(short *)(&pfVar1->fd + 1) = (short)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(short *)((long)pfVar1 + 10),(long)*(short *)((long)pfVar2 + 10),
                         (long)*(short *)((long)pfVar3 + 10));
    *(short *)((long)pfVar1 + 10) = (short)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(short *)((long)pfVar1 + 0xc),
                         (long)*(short *)((long)pfVar2 + 0xc),(long)*(short *)((long)pfVar3 + 0xc));
    *(short *)((long)pfVar1 + 0xc) = (short)iVar4;
    iVar4 = msa_msubv_df(df,(long)*(short *)((long)pfVar1 + 0xe),
                         (long)*(short *)((long)pfVar2 + 0xe),(long)*(short *)((long)pfVar3 + 0xe));
    *(short *)((long)pfVar1 + 0xe) = (short)iVar4;
    break;
  case 2:
    iVar4 = msa_msubv_df(df,(long)(int)pfVar1->fs[0],(long)(int)pfVar2->fs[0],
                         (long)(int)pfVar3->fs[0]);
    pfVar1->fs[0] = (float32)iVar4;
    iVar4 = msa_msubv_df(df,(long)(int)pfVar1->fs[1],(long)(int)pfVar2->fs[1],
                         (long)(int)pfVar3->fs[1]);
    pfVar1->fs[1] = (float32)iVar4;
    iVar4 = msa_msubv_df(df,(long)(int)(&pfVar1->fd)[1],(long)(int)(&pfVar2->fd)[1],
                         (long)(int)(&pfVar3->fd)[1]);
    *(int *)(&pfVar1->fd + 1) = (int)iVar4;
    iVar4 = msa_msubv_df(df,(long)(int)pfVar1->fs[3],(long)(int)pfVar2->fs[3],
                         (long)(int)pfVar3->fs[3]);
    pfVar1->fs[3] = (float32)iVar4;
    break;
  case 3:
    fVar5 = msa_msubv_df(df,pfVar1->fd,pfVar2->fd,pfVar3->fd);
    pfVar1->fd = fVar5;
    fVar5 = msa_msubv_df(df,(&pfVar1->fd)[1],(&pfVar2->fd)[1],(&pfVar3->fd)[1]);
    (&pfVar1->fd)[1] = fVar5;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1396,
                  "void helper_msa_msubv_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  return;
}

Assistant:

MSA_TEROP_DF(maddv)
MSA_TEROP_DF(msubv)
MSA_TEROP_DF(dpadd_s)
MSA_TEROP_DF(dpadd_u)
MSA_TEROP_DF(dpsub_s)
MSA_TEROP_DF(dpsub_u)
MSA_TEROP_DF(binsl)
MSA_TEROP_DF(binsr)
MSA_TEROP_DF(madd_q)
MSA_TEROP_DF(msub_q)
MSA_TEROP_DF(maddr_q)
MSA_TEROP_DF(msubr_q)
#undef MSA_TEROP_DF

static inline void msa_splat_df(uint32_t df, wr_t *pwd,
                                wr_t *pws, target_ulong rt)
{
    uint32_t n = rt % DF_ELEMENTS(df);
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwd->b[i] = pws->b[n];
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwd->h[i] = pws->h[n];
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwd->w[i] = pws->w[n];
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            pwd->d[i] = pws->d[n];
        }
       break;
    default:
        assert(0);
    }
}